

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLeSample * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (LightLeSample *__return_storage_ptr__,DiffuseAreaLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar20 [48];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [56];
  undefined1 auVar28 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [56];
  undefined1 auVar32 [64];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  SampledSpectrum SVar47;
  optional<pbrt::ShapeSample> ss;
  Tuple3<pbrt::Vector3,_float> local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [52];
  Point2f local_d4 [4];
  bool local_b0;
  SampledSpectrum local_a8;
  Tuple3<pbrt::Point3,_float> local_98;
  RayDifferential local_88;
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar20 = in_ZmmResult._16_48_;
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::Sample(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
            ((optional<pbrt::ShapeSample> *)local_108,&this->shape,(anon_class_8_1_54a39815)u1);
  if (local_b0 == false) goto LAB_0038800b;
  local_d4._12_8_ = &(this->super_LightBase).mediumInterface;
  local_128.x = 0.0;
  local_128.y = 0.0;
  local_128.z = 0.0;
  fVar10 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
  local_108._24_4_ = time;
  if (this->twoSided == true) {
    fVar21 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
    if (0.5 <= fVar10) {
      auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar10 + -0.5 + fVar10 + -0.5)));
      auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar21),0x10);
      auVar24._0_4_ = auVar13._0_4_ + auVar13._0_4_;
      auVar24._4_4_ = auVar13._4_4_ + auVar13._4_4_;
      auVar24._8_4_ = auVar13._8_4_ + auVar13._8_4_;
      auVar24._12_4_ = auVar13._12_4_ + auVar13._12_4_;
      auVar5._8_4_ = 0xbf800000;
      auVar5._0_8_ = 0xbf800000bf800000;
      auVar5._12_4_ = 0xbf800000;
      auVar11 = vaddps_avx512vl(auVar24,auVar5);
      auVar13 = vmovshdup_avx(auVar11);
      fVar21 = auVar11._0_4_;
      fVar10 = auVar13._0_4_;
      if (fVar21 == 0.0) {
        auVar13 = ZEXT816(0);
        if ((fVar10 != 0.0) || (NAN(fVar10))) goto LAB_00387ed5;
      }
      else {
LAB_00387ed5:
        auVar6._8_4_ = 0x7fffffff;
        auVar6._0_8_ = 0x7fffffff7fffffff;
        auVar6._12_4_ = 0x7fffffff;
        auVar12 = vandps_avx512vl(auVar11,auVar6);
        auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
        bVar8 = auVar13._0_4_ < auVar12._0_4_;
        auVar37._0_4_ = fVar21 / fVar10;
        auVar37._4_12_ = auVar11._4_12_;
        auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar37,ZEXT416(0x3fc90fdb));
        auVar19._16_48_ = auVar20;
        auVar19._0_16_ = auVar13;
        auVar18._4_60_ = auVar19._4_60_;
        auVar18._0_4_ =
             (float)((uint)bVar8 * (int)((fVar10 / fVar21) * 0.7853982) +
                    (uint)!bVar8 * auVar13._0_4_);
        local_118 = auVar18._0_16_;
        fVar10 = (float)((uint)bVar8 * (int)fVar21 + (uint)!bVar8 * (int)fVar10);
        fVar21 = cosf(auVar18._0_4_);
        fVar22 = sinf((float)local_118._0_4_);
        auVar13 = vinsertps_avx(ZEXT416((uint)(fVar10 * fVar21)),ZEXT416((uint)(fVar10 * fVar22)),
                                0x10);
      }
      auVar12 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
      auVar11 = vmovshdup_avx(auVar13);
      auVar11 = vfnmadd213ss_fma(auVar11,auVar11,auVar12);
      auVar11 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
      if (auVar11._0_4_ < 0.0) {
        auVar27._0_4_ = sqrtf(auVar11._0_4_);
        auVar27._4_60_ = extraout_var_00;
        auVar11 = auVar27._0_16_;
      }
      else {
        auVar11 = vsqrtss_avx(auVar11,auVar11);
      }
      local_128._0_8_ = vmovlps_avx(auVar13);
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(auVar11,auVar7);
    }
    else {
      auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar10 + fVar10)));
      auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar21),0x10);
      auVar23._0_4_ = auVar13._0_4_ + auVar13._0_4_;
      auVar23._4_4_ = auVar13._4_4_ + auVar13._4_4_;
      auVar23._8_4_ = auVar13._8_4_ + auVar13._8_4_;
      auVar23._12_4_ = auVar13._12_4_ + auVar13._12_4_;
      auVar1._8_4_ = 0xbf800000;
      auVar1._0_8_ = 0xbf800000bf800000;
      auVar1._12_4_ = 0xbf800000;
      auVar11 = vaddps_avx512vl(auVar23,auVar1);
      auVar13 = vmovshdup_avx(auVar11);
      fVar21 = auVar11._0_4_;
      fVar10 = auVar13._0_4_;
      if (fVar21 == 0.0) {
        auVar12 = ZEXT816(0);
        if ((fVar10 != 0.0) || (NAN(fVar10))) goto LAB_00387cfb;
      }
      else {
LAB_00387cfb:
        auVar2._8_4_ = 0x7fffffff;
        auVar2._0_8_ = 0x7fffffff7fffffff;
        auVar2._12_4_ = 0x7fffffff;
        auVar12 = vandps_avx512vl(auVar11,auVar2);
        auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
        bVar8 = auVar13._0_4_ < auVar12._0_4_;
        auVar35._0_4_ = fVar21 / fVar10;
        auVar35._4_12_ = auVar11._4_12_;
        auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar35,ZEXT416(0x3fc90fdb));
        auVar15._16_48_ = auVar20;
        auVar15._0_16_ = auVar13;
        auVar14._4_60_ = auVar15._4_60_;
        auVar14._0_4_ =
             (float)((uint)bVar8 * (int)((fVar10 / fVar21) * 0.7853982) +
                    (uint)!bVar8 * auVar13._0_4_);
        local_118 = auVar14._0_16_;
        fVar10 = (float)((uint)bVar8 * (int)fVar21 + (uint)!bVar8 * (int)fVar10);
        fVar21 = cosf(auVar14._0_4_);
        fVar22 = sinf((float)local_118._0_4_);
        auVar12 = vinsertps_avx(ZEXT416((uint)(fVar10 * fVar21)),ZEXT416((uint)(fVar10 * fVar22)),
                                0x10);
      }
      auVar11 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar12,auVar12);
      auVar13 = vmovshdup_avx(auVar12);
      auVar13 = vfnmadd213ss_fma(auVar13,auVar13,auVar11);
      auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x40);
      if (auVar13._0_4_ < 0.0) {
        auVar26._0_4_ = sqrtf(auVar13._0_4_);
        auVar26._4_60_ = extraout_var;
        auVar13 = auVar26._0_16_;
      }
      else {
        auVar13 = vsqrtss_avx(auVar13,auVar13);
      }
      local_128._0_8_ = vmovlps_avx(auVar12);
    }
    local_128.z = auVar13._0_4_;
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(auVar13,auVar3);
    fVar10 = auVar13._0_4_ * 0.31830987 * 0.5;
  }
  else {
    auVar13 = vinsertps_avx(ZEXT416((uint)fVar10),
                            ZEXT416((uint)(u2->super_Tuple2<pbrt::Point2,_float>).y),0x10);
    auVar11._0_4_ = auVar13._0_4_ + auVar13._0_4_;
    auVar11._4_4_ = auVar13._4_4_ + auVar13._4_4_;
    auVar11._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    auVar11._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    auVar13._8_4_ = 0xbf800000;
    auVar13._0_8_ = 0xbf800000bf800000;
    auVar13._12_4_ = 0xbf800000;
    auVar11 = vaddps_avx512vl(auVar11,auVar13);
    auVar13 = vmovshdup_avx(auVar11);
    fVar21 = auVar11._0_4_;
    fVar10 = auVar13._0_4_;
    if (fVar21 == 0.0) {
      auVar13 = ZEXT816(0);
      if ((fVar10 != 0.0) || (NAN(fVar10))) goto LAB_00387ddd;
    }
    else {
LAB_00387ddd:
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      auVar12 = vandps_avx512vl(auVar11,auVar12);
      auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
      bVar8 = auVar13._0_4_ < auVar12._0_4_;
      auVar36._0_4_ = fVar21 / fVar10;
      auVar36._4_12_ = auVar11._4_12_;
      auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar36,ZEXT416(0x3fc90fdb));
      auVar17._16_48_ = auVar20;
      auVar17._0_16_ = auVar13;
      auVar16._4_60_ = auVar17._4_60_;
      auVar16._0_4_ =
           (float)((uint)bVar8 * (int)((fVar10 / fVar21) * 0.7853982) + (uint)!bVar8 * auVar13._0_4_
                  );
      local_118 = auVar16._0_16_;
      fVar10 = (float)((uint)bVar8 * (int)fVar21 + (uint)!bVar8 * (int)fVar10);
      fVar21 = cosf(auVar16._0_4_);
      fVar22 = sinf((float)local_118._0_4_);
      auVar13 = vinsertps_avx(ZEXT416((uint)(fVar10 * fVar21)),ZEXT416((uint)(fVar10 * fVar22)),0x10
                             );
    }
    auVar12 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
    auVar11 = vmovshdup_avx(auVar13);
    auVar11 = vfnmadd213ss_fma(auVar11,auVar11,auVar12);
    auVar11 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
    if (auVar11._0_4_ < 0.0) {
      local_128.z = sqrtf(auVar11._0_4_);
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      local_128.z = auVar11._0_4_;
    }
    local_128._0_8_ = vmovlps_avx(auVar13);
    fVar10 = local_128.z * 0.31830987;
  }
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    if (local_b0 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
    }
    auVar30._8_4_ = 0x80000000;
    auVar30._0_8_ = 0x8000000080000000;
    auVar30._12_4_ = 0x80000000;
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar11 = vpternlogd_avx512vl(auVar38,ZEXT416((uint)local_108._48_4_),auVar30,0xf8);
    fVar34 = auVar11._0_4_;
    auVar40._0_4_ = -1.0 / ((float)local_108._48_4_ + fVar34);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_108._40_8_;
    auVar13 = vmovshdup_avx(auVar44);
    fVar43 = (float)local_108._40_8_;
    fVar22 = fVar43 * auVar13._0_4_ * auVar40._0_4_;
    auVar45._0_4_ = fVar43 * fVar34 * fVar43;
    fVar21 = SUB84(local_108._40_8_,4);
    auVar45._4_4_ = fVar21 * 0.0;
    auVar45._8_8_ = 0;
    auVar40._4_4_ = auVar40._0_4_;
    auVar40._8_4_ = auVar40._0_4_;
    auVar40._12_4_ = auVar40._0_4_;
    auVar46._8_4_ = 0x3f800000;
    auVar46._0_8_ = 0x3f8000003f800000;
    auVar46._12_4_ = 0x3f800000;
    auVar13 = vunpcklps_avx(auVar46,auVar11);
    auVar36 = vfmadd231ps_fma(auVar13,auVar45,auVar40);
    auVar41._8_8_ = 0;
    auVar41._0_4_ = local_128.x;
    auVar41._4_4_ = local_128.y;
    fVar39 = local_128.x;
    auVar12 = vshufps_avx(auVar41,auVar41,0xe1);
    auVar13 = vinsertps_avx(ZEXT416((uint)fVar22),ZEXT416((uint)(fVar34 * fVar22)),0x10);
    auVar42._0_4_ = fVar43 * fVar39;
    auVar42._4_4_ = fVar21 * local_128.y;
    auVar42._8_8_ = 0;
    auVar11 = vmovshdup_avx(auVar42);
    auVar31._0_4_ = fVar43 * local_128.z + fVar39 * auVar36._0_4_ + auVar12._0_4_ * auVar13._0_4_;
    auVar31._4_4_ =
         fVar21 * local_128.z + local_128.y * auVar36._4_4_ + auVar12._4_4_ * auVar13._4_4_;
    auVar31._8_4_ = local_128.z * 0.0 + auVar36._8_4_ * 0.0 + auVar12._8_4_ * auVar13._8_4_;
    auVar31._12_4_ = local_128.z * 0.0 + auVar36._12_4_ * 0.0 + auVar12._12_4_ * auVar13._12_4_;
    local_128._0_8_ = vmovlps_avx(auVar31);
    auVar9._4_8_ = local_108._4_8_;
    auVar9._0_4_ = local_108._0_4_;
    auVar9._12_4_ = local_108._12_4_;
    auVar13 = vinsertps_avx(auVar9,ZEXT416((uint)local_108._12_4_),0x10);
    auVar25._0_4_ = (float)local_108._4_8_ + auVar13._0_4_;
    auVar25._4_4_ = SUB84(local_108._4_8_,4) + auVar13._4_4_;
    auVar25._8_4_ = auVar13._8_4_ + 0.0;
    auVar25._12_4_ = auVar13._12_4_ + 0.0;
    auVar4._8_4_ = 0x3f000000;
    auVar4._0_8_ = 0x3f0000003f000000;
    auVar4._12_4_ = 0x3f000000;
    auVar13 = vmulps_avx512vl(auVar25,auVar4);
    auVar29 = ZEXT856(auVar13._8_8_);
    local_98.z = ((float)local_108._16_4_ + (float)local_108._20_4_) * 0.5;
    auVar33 = (undefined1  [56])0x0;
    local_98._0_8_ = vmovlps_avx(auVar13);
    local_128.z = (fVar39 * fVar43 * -fVar34 - auVar11._0_4_) +
                  (float)local_108._48_4_ * local_128.z;
    SVar47 = L(this,(Point3f *)&local_98,(Normal3f *)(local_108 + 0x28),local_d4,
               (Vector3f *)&local_128,lambda);
    auVar32._0_8_ = SVar47.values.values._8_8_;
    auVar32._8_56_ = auVar33;
    auVar28._0_8_ = SVar47.values.values._0_8_;
    auVar28._8_56_ = auVar29;
    local_a8.values.values = (array<float,_4>)vmovlhps_avx(auVar28._0_16_,auVar32._0_16_);
    if ((local_b0 == true) &&
       (Interaction::SpawnRay(&local_88,(Interaction *)local_108,(Vector3f *)&local_128),
       local_b0 != false)) {
      LightLeSample::LightLeSample
                (__return_storage_ptr__,&local_a8,&local_88.super_Ray,(Interaction *)local_108,
                 local_d4[3].super_Tuple2<pbrt::Point2,_float>.y,fVar10);
      return __return_storage_ptr__;
    }
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
  }
LAB_0038800b:
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
  *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
  __return_storage_ptr__->pdfPos = 0.0;
  __return_storage_ptr__->pdfDir = 0.0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
  (__return_storage_ptr__->L).values.values[0] = 0.0;
  (__return_storage_ptr__->L).values.values[1] = 0.0;
  (__return_storage_ptr__->L).values.values[2] = 0.0;
  (__return_storage_ptr__->L).values.values[3] = 0.0;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample DiffuseAreaLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    // Sample a point on the area light's _Shape_
    Float pdfDir;
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    if (twoSided) {
        Point2f u = u2;
        // Choose a side to sample and then remap u[0] to [0,1] before
        // applying cosine-weighted hemisphere sampling for the chosen side.
        if (u[0] < .5) {
            u[0] = std::min(u[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
        } else {
            u[0] = std::min((u[0] - .5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
            w.z *= -1;
        }
        pdfDir = 0.5f * CosineHemispherePDF(std::abs(w.z));
    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }

    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    Frame nFrame = Frame::FromZ(ss->intr.n);
    w = nFrame.FromLocal(w);
    return LightLeSample(L(ss->intr.p(), ss->intr.n, ss->intr.uv, w, lambda),
                         ss->intr.SpawnRay(w), ss->intr, ss->pdf, pdfDir);
}